

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLAES.cpp
# Opt level: O3

EVP_CIPHER * __thiscall OSSLAES::getCipher(OSSLAES *this)

{
  SymmetricKey *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  EVP_CIPHER *pEVar4;
  undefined4 extraout_var_06;
  undefined4 extraout_var_02;
  
  pSVar1 = (this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey;
  if (pSVar1 != (SymmetricKey *)0x0) {
    iVar2 = (*(pSVar1->super_Serialisable)._vptr_Serialisable[7])();
    if (((CONCAT44(extraout_var,iVar2) == 0x80) ||
        (iVar2 = (*(((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey)->
                   super_Serialisable)._vptr_Serialisable[7])(),
        CONCAT44(extraout_var_00,iVar2) == 0xc0)) ||
       (iVar2 = (*(((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey)->
                  super_Serialisable)._vptr_Serialisable[7])(),
       CONCAT44(extraout_var_01,iVar2) == 0x100)) {
      switch((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentCipherMode) {
      case CBC:
        iVar2 = (*(((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey)->
                  super_Serialisable)._vptr_Serialisable[7])();
        lVar3 = CONCAT44(extraout_var_02,iVar2);
        if (lVar3 == 0x100) {
          pEVar4 = EVP_aes_256_cbc();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0xc0) {
          pEVar4 = EVP_aes_192_cbc();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0x80) {
          pEVar4 = EVP_aes_128_cbc();
          return (EVP_CIPHER *)pEVar4;
        }
        break;
      case CTR:
        iVar2 = (*(((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey)->
                  super_Serialisable)._vptr_Serialisable[7])();
        lVar3 = CONCAT44(extraout_var_04,iVar2);
        if (lVar3 == 0x100) {
          pEVar4 = EVP_aes_256_ctr();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0xc0) {
          pEVar4 = EVP_aes_192_ctr();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0x80) {
          pEVar4 = EVP_aes_128_ctr();
          return (EVP_CIPHER *)pEVar4;
        }
        break;
      case ECB:
        iVar2 = (*(((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey)->
                  super_Serialisable)._vptr_Serialisable[7])();
        lVar3 = CONCAT44(extraout_var_03,iVar2);
        if (lVar3 == 0x100) {
          pEVar4 = EVP_aes_256_ecb();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0xc0) {
          pEVar4 = EVP_aes_192_ecb();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0x80) {
          pEVar4 = EVP_aes_128_ecb();
          return (EVP_CIPHER *)pEVar4;
        }
        break;
      case GCM:
        iVar2 = (*(((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey)->
                  super_Serialisable)._vptr_Serialisable[7])();
        lVar3 = CONCAT44(extraout_var_05,iVar2);
        if (lVar3 == 0x100) {
          pEVar4 = EVP_aes_256_gcm();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0xc0) {
          pEVar4 = EVP_aes_192_gcm();
          return (EVP_CIPHER *)pEVar4;
        }
        if (lVar3 == 0x80) {
          pEVar4 = EVP_aes_128_gcm();
          return (EVP_CIPHER *)pEVar4;
        }
      }
      softHSMLog(3,"getCipher",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                 ,0x10a,"Invalid AES cipher mode %i",
                 (ulong)(this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.
                        currentCipherMode);
    }
    else {
      iVar2 = (*(((this->super_OSSLEVPSymmetricAlgorithm).super_SymmetricAlgorithm.currentKey)->
                super_Serialisable)._vptr_Serialisable[7])();
      softHSMLog(3,"getCipher",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                 ,0xd3,"Invalid AES currentKey length (%d bits)",CONCAT44(extraout_var_06,iVar2));
    }
  }
  return (EVP_CIPHER *)0x0;
}

Assistant:

const EVP_CIPHER* OSSLAES::getCipher() const
{
	if (currentKey == NULL) return NULL;

	// Check currentKey bit length; AES only supports 128, 192 or 256 bit keys
	if ((currentKey->getBitLen() != 128) &&
	    (currentKey->getBitLen() != 192) &&
            (currentKey->getBitLen() != 256))
	{
		ERROR_MSG("Invalid AES currentKey length (%d bits)", currentKey->getBitLen());

		return NULL;
	}

	// Determine the cipher mode
	if (currentCipherMode == SymMode::CBC)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_cbc();
			case 192:
				return EVP_aes_192_cbc();
			case 256:
				return EVP_aes_256_cbc();
		};
	}
	else if (currentCipherMode == SymMode::ECB)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_ecb();
			case 192:
				return EVP_aes_192_ecb();
			case 256:
				return EVP_aes_256_ecb();
		};
	}
	else if (currentCipherMode == SymMode::CTR)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_ctr();
			case 192:
				return EVP_aes_192_ctr();
			case 256:
				return EVP_aes_256_ctr();
		};
	}
	else if (currentCipherMode == SymMode::GCM)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_gcm();
			case 192:
				return EVP_aes_192_gcm();
			case 256:
				return EVP_aes_256_gcm();
		};
	}

	ERROR_MSG("Invalid AES cipher mode %i", currentCipherMode);

	return NULL;
}